

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void reportPresolveReductions(HighsLogOptions *log_options,HighsLp *lp,bool presolve_to_empty)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  string message;
  
  uVar2 = lp->num_col_;
  uVar3 = lp->num_row_;
  uVar4 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)uVar2];
  paVar1 = &message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  message._M_dataplus._M_p = (pointer)paVar1;
  if ((int)CONCAT71(in_register_00000011,presolve_to_empty) == 0) {
    std::__cxx11::string::_M_replace((ulong)&message,0,(char *)0x0,0x3ca84d);
    uVar6 = (ulong)uVar4;
    uVar5 = (ulong)uVar3;
    uVar7 = (ulong)uVar2;
  }
  else {
    uVar6 = 0;
    std::__cxx11::string::_M_replace((ulong)&message,0,(char *)0x0,0x3ca83a);
    uVar5 = 0;
    uVar7 = 0;
  }
  highsLogUser(log_options,kInfo,
               "Presolve : Reductions: rows %d(-%d); columns %d(-%d); elements %d(-%d) %s\n",uVar5,
               (ulong)(uVar3 - (int)uVar5),uVar7,(ulong)(uVar2 - (int)uVar7),uVar6,
               (ulong)(uVar4 - (int)uVar6),message._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message._M_dataplus._M_p != paVar1) {
    operator_delete(message._M_dataplus._M_p);
  }
  return;
}

Assistant:

void reportPresolveReductions(const HighsLogOptions& log_options,
                              const HighsLp& lp, const bool presolve_to_empty) {
  HighsInt num_col_from = lp.num_col_;
  HighsInt num_row_from = lp.num_row_;
  HighsInt num_els_from = lp.a_matrix_.start_[num_col_from];
  HighsInt num_col_to;
  HighsInt num_row_to;
  HighsInt num_els_to;
  std::string message;
  if (presolve_to_empty) {
    num_col_to = 0;
    num_row_to = 0;
    num_els_to = 0;
    message = "- Reduced to empty";
  } else {
    num_col_to = num_col_from;
    num_row_to = num_row_from;
    num_els_to = num_els_from;
    message = "- Not reduced";
  }
  highsLogUser(log_options, HighsLogType::kInfo,
               "Presolve : Reductions: rows %" HIGHSINT_FORMAT
               "(-%" HIGHSINT_FORMAT "); columns %" HIGHSINT_FORMAT
               "(-%" HIGHSINT_FORMAT
               "); "
               "elements %" HIGHSINT_FORMAT "(-%" HIGHSINT_FORMAT ") %s\n",
               num_row_to, (num_row_from - num_row_to), num_col_to,
               (num_col_from - num_col_to), num_els_to,
               (num_els_from - num_els_to), message.c_str());
}